

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image_mono
          (Fl_PostScript_Graphics_Driver *this,uchar *data,int ix,int iy,int iw,int ih,int D,int LD)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  byte b;
  void *data_00;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  Fl_PostScript_Graphics_Driver *this_00;
  char *pcVar10;
  uchar *puVar11;
  byte *pbVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  byte *local_68;
  
  dVar13 = (double)ix;
  dVar14 = (double)iw;
  dVar15 = (double)ih;
  fwrite("save\n",5,1,(FILE *)this->output);
  if (this->lang_level_ < 2) {
    this_00 = (Fl_PostScript_Graphics_Driver *)this->output;
    fprintf((FILE *)this_00,"%g %g %g %g %i %i GI",dVar13,(double)iy + dVar15,dVar14,-dVar15,
            (ulong)(uint)iw,(ulong)(uint)ih);
  }
  else {
    pcVar10 = "true";
    if (this->interpolate_ == 0) {
      pcVar10 = "false";
    }
    this_00 = (Fl_PostScript_Graphics_Driver *)this->output;
    dVar16 = (double)iy + dVar15;
    if ((this->lang_level_ == 2) || (this->mask == (uchar *)0x0)) {
      fprintf((FILE *)this_00,"%g %g %g %g %i %i %s GII\n",dVar13,dVar16,dVar14,-dVar15,
              (ulong)(uint)iw,(ulong)(uint)ih);
    }
    else {
      fprintf((FILE *)this_00,"%g %g %g %g %i %i %i %i %s GIM\n",dVar13,dVar16,dVar14,-dVar15,
              (ulong)(uint)iw,(ulong)(uint)ih,(ulong)(uint)this->mx,(ulong)(uint)this->my,pcVar10);
    }
  }
  iVar4 = D * iw;
  if (LD != 0) {
    iVar4 = LD;
  }
  bVar1 = this->bg_r;
  bVar2 = this->bg_g;
  bVar3 = this->bg_b;
  puVar11 = this->mask;
  data_00 = prepare_rle85(this_00);
  if (iw < 1) {
    iw = 0;
  }
  uVar5 = 0;
  uVar7 = 0;
  if (0 < ih) {
    uVar7 = (ulong)(uint)ih;
  }
  local_68 = data + 1;
  for (; uVar5 != uVar7; uVar5 = uVar5 + 1) {
    pbVar12 = local_68;
    iVar8 = iw;
    if (this->mask != (uchar *)0x0) {
      for (iVar6 = 0; iVar6 < this->my / ih; iVar6 = iVar6 + 1) {
        for (lVar9 = 0; (int)lVar9 < (this->mx + 7) / 8; lVar9 = lVar9 + 1) {
          write_rle85(this,""[puVar11[lVar9] & 0xf] << 4 | ""[puVar11[lVar9] >> 4],data_00);
        }
        puVar11 = puVar11 + lVar9;
      }
    }
    while (iVar8 != 0) {
      b = pbVar12[-1];
      if ((1 < D) && (this->lang_level_ < 3)) {
        b = (byte)((ulong)((uint)b * (uint)*pbVar12 +
                          (*pbVar12 ^ 0xff) * (((uint)bVar3 + (uint)bVar2 + (uint)bVar1) / 3)) /
                  0xff);
      }
      write_rle85(this,b,data_00);
      pbVar12 = pbVar12 + D;
      iVar8 = iVar8 + -1;
    }
    local_68 = local_68 + iVar4;
  }
  close_rle85(this,data_00);
  fwrite("restore\n",8,1,(FILE *)this->output);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image_mono(const uchar *data, int ix, int iy, int iw, int ih, int D, int LD) {
  double x = ix, y = iy, w = iw, h = ih;

  fprintf(output,"save\n");

  int i,j, k;

  const char * interpol;
  if (lang_level_>1){
    if (interpolate_)
      interpol="true";
    else
      interpol="false";
    if (mask && lang_level_>2)
      fprintf(output, "%g %g %g %g %i %i %i %i %s GIM\n", x , y+h , w , -h , iw , ih, mx, my, interpol);
    else
      fprintf(output, "%g %g %g %g %i %i %s GII\n", x , y+h , w , -h , iw , ih, interpol);
  }else
    fprintf(output , "%g %g %g %g %i %i GI", x , y+h , w , -h , iw , ih);


  if (!LD) LD = iw*D;


  int bg = (bg_r + bg_g + bg_b)/3;

  uchar *curmask=mask;
  void *big = prepare_rle85();
  for (j=0; j<ih;j++){
    if (mask){
      for (k=0;k<my/ih;k++){
        for (i=0; i<((mx+7)/8);i++){
          write_rle85(swap_byte(*curmask), big);
          curmask++;
        }
      }
    }
    const uchar *curdata=data+j*LD;
    for (i=0 ; i<iw ; i++) {
      uchar r = curdata[0];
      if (lang_level_<3 && D>1) { //can do  mixing

        unsigned int a2 = curdata[1]; //must be int
        unsigned int a = 255-a2;
        r = (a2 * r + bg * a)/255;
      }
      write_rle85(r, big);
      curdata +=D;
    }

  }
  close_rle85(big);
  fprintf(output,"restore\n");
}